

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O0

int scaling_list_data(HEVCContext *s,ScalingList *sl,HEVCSPS *sps)

{
  BitReadCtx_t *bitctx;
  MPP_RET MVar1;
  int iVar2;
  int local_9c;
  int local_98;
  RK_S32 local_94;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 scaling_list_delta_coef;
  RK_S32 coef_num;
  RK_S32 next_coef;
  RK_U32 _out_1;
  RK_U32 delta;
  RK_S32 _out;
  RK_U32 matrix_id;
  RK_S32 pos;
  RK_S32 i;
  RK_S32 size_id;
  RK_S32 scaling_list_dc_coef [2] [6];
  RK_U8 scaling_list_pred_mode_flag;
  BitReadCtx_t *gb;
  HEVCSPS *sps_local;
  ScalingList *sl_local;
  HEVCContext *s_local;
  
  bitctx = &s->HEVClc->gb;
  pos = 0;
  do {
    if (3 < pos) {
      if (sps->chroma_format_idc == 3) {
        for (matrix_id = 0; (int)matrix_id < 0x40; matrix_id = matrix_id + 1) {
          sl->sl[3][1][(int)matrix_id] = sl->sl[2][1][(int)matrix_id];
          sl->sl[3][2][(int)matrix_id] = sl->sl[2][2][(int)matrix_id];
          *(RK_U8 *)((long)(sl->sl_dc + -0x16) + (long)(int)matrix_id + 4) =
               sl->sl[2][4][(int)matrix_id];
          *(RK_U8 *)((long)(sl->sl_dc + -0xb) + (long)(int)matrix_id + 2) =
               sl->sl[2][5][(int)matrix_id];
        }
        sl->sl_dc[1][1] = sl->sl_dc[0][1];
        sl->sl_dc[1][2] = sl->sl_dc[0][2];
        sl->sl_dc[1][4] = sl->sl_dc[0][4];
        sl->sl_dc[1][5] = sl->sl_dc[0][5];
      }
      return 0;
    }
    for (delta = 0; delta < 6; delta = iVar2 + delta) {
      MVar1 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out_1);
      bitctx->ret = MVar1;
      if (bitctx->ret != MPP_OK) {
        return -0x3ec;
      }
      scaling_list_dc_coef[1][5]._3_1_ = (char)_out_1;
      if (scaling_list_dc_coef[1][5]._3_1_ == '\0') {
        next_coef = 0;
        MVar1 = mpp_read_ue(bitctx,(RK_U32 *)&coef_num);
        bitctx->ret = MVar1;
        if (bitctx->ret != MPP_OK) {
          return -0x3ec;
        }
        next_coef = coef_num;
        if (coef_num != 0) {
          iVar2 = 1;
          if (pos == 3) {
            iVar2 = 3;
          }
          next_coef = iVar2 * coef_num;
          if (delta < (uint)next_coef) {
            _mpp_log_l(2,"H265PARSER_PS","Invalid delta in scaling list data: %d.\n",(char *)0x0,
                       (ulong)(uint)next_coef);
            return -0x3ec;
          }
          iVar2 = 0x10;
          if (0 < pos) {
            iVar2 = 0x40;
          }
          memcpy(sl->sl[pos] + delta,sl->sl[pos] + (delta - next_coef),(long)iVar2);
          if (1 < pos) {
            sl->sl_dc[pos + -2][delta] = sl->sl_dc[pos + -2][delta - next_coef];
          }
        }
      }
      else {
        scaling_list_delta_coef = 8;
        if (1 << ((char)(pos << 1) + 4U & 0x1f) < 0x40) {
          local_9c = 1 << ((char)(pos << 1) + 4U & 0x1f);
        }
        else {
          local_9c = 0x40;
        }
        _out_2 = local_9c;
        if (1 < pos) {
          MVar1 = mpp_read_se(bitctx,&local_94);
          bitctx->ret = MVar1;
          if (bitctx->ret != MPP_OK) {
            return -0x3ec;
          }
          (&i)[(long)(pos + -2) * 6 + (ulong)delta] = local_94;
          (&i)[(long)(pos + -2) * 6 + (ulong)delta] = (&i)[(long)(pos + -2) * 6 + (ulong)delta] + 8;
          scaling_list_delta_coef = (&i)[(long)(pos + -2) * 6 + (ulong)delta];
          sl->sl_dc[pos + -2][delta] = (RK_U8)scaling_list_delta_coef;
        }
        for (matrix_id = 0; (int)matrix_id < _out_2; matrix_id = matrix_id + 1) {
          if (pos == 0) {
            _out = (uint)""[(int)matrix_id] * 4 + (uint)""[(int)matrix_id];
          }
          else {
            _out = (uint)""[(int)matrix_id] * 8 + (uint)""[(int)matrix_id];
          }
          MVar1 = mpp_read_se(bitctx,&local_98);
          bitctx->ret = MVar1;
          if (bitctx->ret != MPP_OK) {
            return -0x3ec;
          }
          scaling_list_delta_coef = (scaling_list_delta_coef + local_98 + 0x100) % 0x100;
          sl->sl[pos][delta][_out] = (RK_U8)scaling_list_delta_coef;
        }
      }
      iVar2 = 1;
      if (pos == 3) {
        iVar2 = 3;
      }
    }
    pos = pos + 1;
  } while( true );
}

Assistant:

static int scaling_list_data(HEVCContext *s, ScalingList *sl, HEVCSPS *sps)
{
    BitReadCtx_t *gb = &s->HEVClc->gb;
    RK_U8 scaling_list_pred_mode_flag;
    RK_S32 scaling_list_dc_coef[2][6];
    RK_S32 size_id,  i, pos;
    RK_U32 matrix_id;

    for (size_id = 0; size_id < 4; size_id++)
        for (matrix_id = 0; matrix_id < 6; matrix_id += ((size_id == 3) ? 3 : 1)) {
            READ_ONEBIT(gb, &scaling_list_pred_mode_flag);
            if (!scaling_list_pred_mode_flag) {
                RK_U32 delta = 0;
                READ_UE(gb, &delta);
                /* Only need to handle non-zero delta. Zero means default,
                 * which should already be in the arrays. */
                if (delta) {
                    // Copy from previous array.
                    delta *= (size_id == 3) ? 3 : 1;
                    if (matrix_id < delta) {
                        mpp_err(
                            "Invalid delta in scaling list data: %d.\n", delta);
                        return  MPP_ERR_STREAM;
                    }

                    memcpy(sl->sl[size_id][matrix_id],
                           sl->sl[size_id][matrix_id - delta],
                           size_id > 0 ? 64 : 16);
                    if (size_id > 1)
                        sl->sl_dc[size_id - 2][matrix_id] = sl->sl_dc[size_id - 2][matrix_id - delta];
                }
            } else {
                RK_S32 next_coef, coef_num;
                RK_S32 scaling_list_delta_coef;

                next_coef = 8;
                coef_num  = MPP_MIN(64, 1 << (4 + (size_id << 1)));
                if (size_id > 1) {
                    READ_SE(gb, &scaling_list_dc_coef[size_id - 2][matrix_id]);
                    scaling_list_dc_coef[size_id - 2][matrix_id] =  scaling_list_dc_coef[size_id - 2][matrix_id] + 8;
                    next_coef = scaling_list_dc_coef[size_id - 2][matrix_id];
                    sl->sl_dc[size_id - 2][matrix_id] = next_coef;
                }
                for (i = 0; i < coef_num; i++) {
                    if (size_id == 0)
                        pos = 4 * mpp_hevc_diag_scan4x4_y[i] +
                              mpp_hevc_diag_scan4x4_x[i];
                    else
                        pos = 8 * mpp_hevc_diag_scan8x8_y[i] +
                              mpp_hevc_diag_scan8x8_x[i];

                    READ_SE(gb, &scaling_list_delta_coef);
                    next_coef = (next_coef + scaling_list_delta_coef + 256) % 256;
                    sl->sl[size_id][matrix_id][pos] = next_coef;
                }
            }
        }
    if (sps->chroma_format_idc == H265_CHROMA_444) {
        for (i = 0; i < 64; i++) {
            sl->sl[3][1][i] = sl->sl[2][1][i];
            sl->sl[3][2][i] = sl->sl[2][2][i];
            sl->sl[3][4][i] = sl->sl[2][4][i];
            sl->sl[3][5][i] = sl->sl[2][5][i];
        }
        sl->sl_dc[1][1] = sl->sl_dc[0][1];
        sl->sl_dc[1][2] = sl->sl_dc[0][2];
        sl->sl_dc[1][4] = sl->sl_dc[0][4];
        sl->sl_dc[1][5] = sl->sl_dc[0][5];
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}